

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O0

void __thiscall
OpenMD::Utils::
AccumulatorView<OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>_>::
writeData(AccumulatorView<OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>_>
          *this,ostream *stream,string *errorMessage,DataHandling dataHandling)

{
  uint uVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  vector<double,_std::allocator<double>_> *this_00;
  reference pvVar3;
  undefined8 uVar4;
  ostream *this_01;
  undefined4 in_ECX;
  ostream *in_RSI;
  long in_RDI;
  int i;
  size_t count;
  vector<double,_std::allocator<double>_> dat;
  Accumulator<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  errorStruct *peVar5;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  vector<double,_std::allocator<double>_> local_b8;
  int local_9c;
  size_t local_40;
  vector<double,_std::allocator<double>_> local_38;
  undefined4 local_1c;
  ostream *local_10;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x34c150);
  local_40 = Accumulator<std::vector<double,_std::allocator<double>_>_>::getCount
                       ((Accumulator<std::vector<double,_std::allocator<double>_>_> *)(in_RDI + 8));
  switch(local_1c) {
  case 0:
    Accumulator<std::vector<double,_std::allocator<double>_>_>::getAverage
              (in_stack_ffffffffffffff08);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff20);
    break;
  case 1:
    Accumulator<std::vector<double,_std::allocator<double>_>_>::getLastValue
              (in_stack_ffffffffffffff08);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff20);
    break;
  case 2:
  case 3:
    snprintf(painCave.errMsg,2000,
             "Max and Min functions are not defined for a std::vector Accumulator.");
    painCave.isFatal = 1;
    simError();
    break;
  case 4:
    Accumulator<std::vector<double,_std::allocator<double>_>_>::getTotal(in_stack_ffffffffffffff08);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff20);
  }
  local_9c = 0;
  do {
    pvVar2 = (vector<double,_std::allocator<double>_> *)(long)local_9c;
    Accumulator<std::vector<double,_std::allocator<double>_>_>::getAverage
              (in_stack_ffffffffffffff08);
    this_00 = (vector<double,_std::allocator<double>_> *)
              std::vector<double,_std::allocator<double>_>::size(&local_b8);
    std::vector<double,_std::allocator<double>_>::~vector(this_00);
    if (this_00 <= pvVar2) {
      std::vector<double,_std::allocator<double>_>::~vector(this_00);
      return;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(long)local_9c);
    uVar1 = std::isinf(*pvVar3);
    if ((uVar1 & 1) == 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(long)local_9c);
      uVar1 = std::isnan(*pvVar3);
      if ((uVar1 & 1) != 0) goto LAB_0034c328;
      if (local_40 == 0) {
        std::operator<<(local_10,'\t');
      }
      else {
        this_01 = std::operator<<(local_10,'\t');
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(long)local_9c);
        std::ostream::operator<<(this_01,*pvVar3);
      }
    }
    else {
LAB_0034c328:
      uVar4 = std::__cxx11::string::c_str();
      peVar5 = &painCave;
      snprintf(painCave.errMsg,2000,"%s",uVar4);
      peVar5->isFatal = 1;
      simError();
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

void writeData(std::ostream& stream, const std::string& errorMessage,
                   DataHandling dataHandling) const override {
      std::vector<RealType> dat;
      std::size_t count = StdVectorAccumulator::getCount();

      switch (dataHandling) {
      case DataHandling::Average:
        dat = StdVectorAccumulator::getAverage();
        break;
      case DataHandling::Last:
        dat = StdVectorAccumulator::getLastValue();
        break;
      case DataHandling::Total:
        dat = StdVectorAccumulator::getTotal();
        break;
      case DataHandling::Max:
      case DataHandling::Min:
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Max and Min functions are not defined for a "
                 "std::vector Accumulator.");
        painCave.isFatal = 1;
        simError();
        break;
      default:
        break;
      }

      for (int i = 0; i < StdVectorAccumulator::getAverage().size(); i++) {
        if (std::isinf(dat[i]) || std::isnan(dat[i])) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                   errorMessage.c_str());
          painCave.isFatal = 1;
          simError();
        } else {
          if (count == 0)
            stream << '\t';
          else
            stream << '\t' << dat[i];
        }
      }
    }